

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
compute_average(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,
               vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
               *to_average)

{
  pointer ppVVar1;
  Vector_distances_in_diagram<Gudhi::Euclidean_distance> *pVVar2;
  long lVar3;
  pointer pdVar4;
  size_t i_2;
  long lVar5;
  size_t i;
  long lVar6;
  long lVar7;
  ulong uVar8;
  size_t j;
  long lVar9;
  ulong __n;
  undefined1 auVar10 [16];
  vector<double,_std::allocator<double>_> av;
  allocator_type local_71;
  value_type_conflict1 local_70;
  Vector_distances_in_diagram<Gudhi::Euclidean_distance> local_68;
  
  ppVVar1 = (to_average->
            super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(to_average->
                super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1;
  if (lVar5 == 0) {
    local_68.sorted_vector_of_distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.sorted_vector_of_distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.intervals.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.sorted_vector_of_distances.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.intervals.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.intervals.
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    operator=(this,&local_68);
    ~Vector_distances_in_diagram(&local_68);
  }
  else {
    __n = 0;
    for (lVar6 = 0; lVar5 >> 3 != lVar6; lVar6 = lVar6 + 1) {
      pVVar2 = ppVVar1[lVar6];
      uVar8 = (long)*(pointer *)
                     ((long)&(pVVar2->sorted_vector_of_distances).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) -
              *(long *)&(pVVar2->sorted_vector_of_distances).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data >> 3;
      if (__n < uVar8) {
        __n = uVar8;
      }
    }
    local_70 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_68,__n,&local_70,&local_71);
    ppVVar1 = (to_average->
              super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(to_average->
                  super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1;
    lVar6 = lVar5 >> 3;
    for (lVar7 = 0; lVar7 != lVar6; lVar7 = lVar7 + 1) {
      pVVar2 = ppVVar1[lVar7];
      lVar3 = *(long *)&(pVVar2->sorted_vector_of_distances).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      pdVar4 = *(pointer *)
                ((long)&(pVVar2->sorted_vector_of_distances).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl + 8);
      for (lVar9 = 0; (long)pdVar4 - lVar3 >> 3 != lVar9; lVar9 = lVar9 + 1) {
        (&(local_68.intervals.
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->first)[lVar9] =
             *(double *)(lVar3 + lVar9 * 8) +
             (&(local_68.intervals.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first)[lVar9];
      }
    }
    auVar10._8_4_ = (int)(lVar5 >> 0x23);
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = 0x45300000;
    for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
      (&(local_68.intervals.
         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_start)->first)[uVar8] =
           (&(local_68.intervals.
              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->first)[uVar8] /
           ((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (&this->sorted_vector_of_distances,
               (vector<double,_std::allocator<double>_> *)&local_68);
    this->where_to_cut =
         (long)local_68.intervals.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_68.intervals.
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_68);
  }
  return;
}

Assistant:

void Vector_distances_in_diagram<F>::compute_average(const std::vector<Vector_distances_in_diagram*>& to_average) {
  if (to_average.size() == 0) {
    (*this) = Vector_distances_in_diagram<F>();
    return;
  }

  size_t maximal_length_of_vector = 0;
  for (size_t i = 0; i != to_average.size(); ++i) {
    if (to_average[i]->sorted_vector_of_distances.size() > maximal_length_of_vector) {
      maximal_length_of_vector = to_average[i]->sorted_vector_of_distances.size();
    }
  }

  std::vector<double> av(maximal_length_of_vector, 0);
  for (size_t i = 0; i != to_average.size(); ++i) {
    for (size_t j = 0; j != to_average[i]->sorted_vector_of_distances.size(); ++j) {
      av[j] += to_average[i]->sorted_vector_of_distances[j];
    }
  }

  for (size_t i = 0; i != maximal_length_of_vector; ++i) {
    av[i] /= static_cast<double>(to_average.size());
  }
  this->sorted_vector_of_distances = av;
  this->where_to_cut = av.size();
}